

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GridDataType2.cpp
# Opt level: O3

KString * __thiscall
KDIS::DATA_TYPE::GridDataType2::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,GridDataType2 *this)

{
  float *pfVar1;
  ostream *poVar2;
  float *pfVar3;
  KStringStream ss;
  KString local_1d0;
  stringstream local_1b0 [16];
  ostream local_1a0 [112];
  ios_base local_130 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  GridData::GetAsString_abi_cxx11_(&local_1d0,&this->super_GridData);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a0,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"GridDataType2:",0xe);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n\tNumber Of Values: ",0x14);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n\tValues: ",10);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  pfVar1 = (this->m_vf32Values).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pfVar3 = (this->m_vf32Values).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start; pfVar3 != pfVar1; pfVar3 = pfVar3 + 1) {
    std::__ostream_insert<char,std::char_traits<char>>(local_1a0," ",1);
    std::ostream::_M_insert<double>((double)*pfVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"\n",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  std::ios_base::~ios_base(local_130);
  return __return_storage_ptr__;
}

Assistant:

KString GridDataType2::GetAsString() const
{
    KStringStream ss;

    ss << GridData::GetAsString()
       << "GridDataType2:"
       << "\n\tNumber Of Values: " << m_ui16NumValues
       << "\n\tValues: ";

    vector<KFLOAT32>::const_iterator citr = m_vf32Values.begin();
    vector<KFLOAT32>::const_iterator citrEnd = m_vf32Values.end();
    for( ; citr != citrEnd; ++citr )
    {
        ss << " " << *citr;
    }
    ss << "\n";

    return ss.str();
}